

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O3

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AlterTableInfo::Deserialize(AlterTableInfo *this,Deserializer *deserializer)

{
  AlterTableType AVar1;
  uint uVar2;
  SerializationException *this_00;
  string str;
  _Alloc_hider local_40;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,300,"alter_table_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&stack0xffffffffffffffc0,deserializer);
    AVar1 = EnumUtil::FromString<duckdb::AlterTableType>(local_40._M_p);
    uVar2 = (uint)AVar1;
    if (local_40._M_p != &stack0xffffffffffffffd0) {
      operator_delete(local_40._M_p);
    }
  }
  else {
    uVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  switch(uVar2 & 0xff) {
  case 1:
    RenameColumnInfo::Deserialize((RenameColumnInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 2:
    RenameTableInfo::Deserialize((RenameTableInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 3:
    AddColumnInfo::Deserialize((AddColumnInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 4:
    RemoveColumnInfo::Deserialize((RemoveColumnInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 5:
    ChangeColumnTypeInfo::Deserialize((ChangeColumnTypeInfo *)&stack0xffffffffffffffc0,deserializer)
    ;
    break;
  case 6:
    SetDefaultInfo::Deserialize((SetDefaultInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 7:
    AlterForeignKeyInfo::Deserialize((AlterForeignKeyInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 8:
    SetNotNullInfo::Deserialize((SetNotNullInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 9:
    DropNotNullInfo::Deserialize((DropNotNullInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_40._M_p = &stack0xffffffffffffffd0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffc0,
               "Unsupported type for deserialization of AlterTableInfo!","");
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffc0);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  case 0xb:
    AddConstraintInfo::Deserialize((AddConstraintInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 0xc:
    SetPartitionedByInfo::Deserialize((SetPartitionedByInfo *)&stack0xffffffffffffffc0,deserializer)
    ;
    break;
  case 0xd:
    SetSortedByInfo::Deserialize((SetSortedByInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 0xe:
    AddFieldInfo::Deserialize((AddFieldInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 0xf:
    RemoveFieldInfo::Deserialize((RemoveFieldInfo *)&stack0xffffffffffffffc0,deserializer);
    break;
  case 0x10:
    RenameFieldInfo::Deserialize((RenameFieldInfo *)&stack0xffffffffffffffc0,deserializer);
  }
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_40._M_p;
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> AlterTableInfo::Deserialize(Deserializer &deserializer) {
	auto alter_table_type = deserializer.ReadProperty<AlterTableType>(300, "alter_table_type");
	unique_ptr<AlterTableInfo> result;
	switch (alter_table_type) {
	case AlterTableType::ADD_COLUMN:
		result = AddColumnInfo::Deserialize(deserializer);
		break;
	case AlterTableType::ADD_CONSTRAINT:
		result = AddConstraintInfo::Deserialize(deserializer);
		break;
	case AlterTableType::ADD_FIELD:
		result = AddFieldInfo::Deserialize(deserializer);
		break;
	case AlterTableType::ALTER_COLUMN_TYPE:
		result = ChangeColumnTypeInfo::Deserialize(deserializer);
		break;
	case AlterTableType::DROP_NOT_NULL:
		result = DropNotNullInfo::Deserialize(deserializer);
		break;
	case AlterTableType::FOREIGN_KEY_CONSTRAINT:
		result = AlterForeignKeyInfo::Deserialize(deserializer);
		break;
	case AlterTableType::REMOVE_COLUMN:
		result = RemoveColumnInfo::Deserialize(deserializer);
		break;
	case AlterTableType::REMOVE_FIELD:
		result = RemoveFieldInfo::Deserialize(deserializer);
		break;
	case AlterTableType::RENAME_COLUMN:
		result = RenameColumnInfo::Deserialize(deserializer);
		break;
	case AlterTableType::RENAME_FIELD:
		result = RenameFieldInfo::Deserialize(deserializer);
		break;
	case AlterTableType::RENAME_TABLE:
		result = RenameTableInfo::Deserialize(deserializer);
		break;
	case AlterTableType::SET_DEFAULT:
		result = SetDefaultInfo::Deserialize(deserializer);
		break;
	case AlterTableType::SET_NOT_NULL:
		result = SetNotNullInfo::Deserialize(deserializer);
		break;
	case AlterTableType::SET_PARTITIONED_BY:
		result = SetPartitionedByInfo::Deserialize(deserializer);
		break;
	case AlterTableType::SET_SORTED_BY:
		result = SetSortedByInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of AlterTableInfo!");
	}
	return std::move(result);
}